

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O2

void __thiscall irr::video::CNullDriver::removeOcclusionQuery(CNullDriver *this,ISceneNode *node)

{
  u32 index;
  SOccQuery local_40;
  
  local_40.Mesh = (IMesh *)0x0;
  local_40.field_2.PID = (void *)0x0;
  local_40.Result = 0xffffffff;
  local_40.Run = 0xffffffff;
  if (node != (ISceneNode *)0x0) {
    *(int *)(node->_vptr_ISceneNode[-3] + -0x20 + (long)(node->AbsoluteTransformation).M) =
         *(int *)(node->_vptr_ISceneNode[-3] + -0x20 + (long)(node->AbsoluteTransformation).M) + 1;
  }
  local_40.Node = node;
  index = core::array<irr::video::CNullDriver::SOccQuery>::linear_search
                    (&this->OcclusionQueries,&local_40);
  SOccQuery::~SOccQuery(&local_40);
  if (index != 0xffffffff) {
    *(byte *)&node->AutomaticCullingState = (byte)node->AutomaticCullingState & 0xf7;
    core::array<irr::video::CNullDriver::SOccQuery>::erase(&this->OcclusionQueries,index);
  }
  return;
}

Assistant:

void CNullDriver::removeOcclusionQuery(scene::ISceneNode *node)
{
	// search for query
	s32 index = OcclusionQueries.linear_search(SOccQuery(node));
	if (index != -1) {
		node->setAutomaticCulling(node->getAutomaticCulling() & ~scene::EAC_OCC_QUERY);
		OcclusionQueries.erase(index);
	}
}